

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolutionWriterTest_CountSolutions_Test::SolutionWriterTest_CountSolutions_Test
          (SolutionWriterTest_CountSolutions_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00259c88;
  return;
}

Assistant:

TEST(SolutionWriterTest, CountSolutions) {
  SolCountingSolver solver(true);
  solver.SetIntOption("countsolutions", 1);
  typedef SolCountingSolver::ProblemBuilder ProblemBuilder;
  ProblemBuilder problem_builder;
  mp::SolutionWriter<SolCountingSolver,
      StrictMock<MockSolWriter<ProblemBuilder> > >
      writer("test", solver, problem_builder);
  int nsol = 5;
  for (int i = 0; i < nsol; ++i)
    writer.HandleFeasibleSolution("", 0, 0, 0);
  EXPECT_CALL(writer.sol_writer(), Write(_, MatchNSol(nsol)));
  writer.HandleSolution(0, "", 0, 0, 0);
}